

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

size_t fs_prep_var(LexState *ls,FuncState *fs,size_t *ofsvar)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  uint *puVar7;
  ulong *in_RDX;
  long in_RSI;
  long in_RDI;
  MSize len_1;
  char *p_1;
  BCPos startpc;
  GCstr *s_1;
  char *p;
  MSize len;
  GCstr *s;
  BCPos lastpc;
  MSize n;
  MSize i;
  VarInfo *ve;
  VarInfo *vs;
  char *p_2;
  MSize in_stack_fffffffffffffecc;
  SBuf *in_stack_fffffffffffffed0;
  char *local_118;
  uint local_e4;
  uint local_dc;
  uint *local_d0;
  SBuf *local_98;
  char *local_80;
  char *local_68;
  char *local_8;
  
  lVar2 = *(long *)(in_RDI + 0x80);
  *(undefined4 *)(in_RDI + 0x3c) = *(undefined4 *)(in_RDI + 0x44);
  local_dc = 0;
  bVar1 = *(byte *)(in_RSI + 0x5b);
  local_98 = in_stack_fffffffffffffed0;
  for (; local_dc < bVar1; local_dc = local_dc + 1) {
    uVar5 = (ulong)*(uint *)(lVar2 + (ulong)*(ushort *)(in_RSI + 0x1ec + (ulong)local_dc * 2) * 0x10
                            );
    uVar3 = *(int *)(uVar5 + 0xc) + 1;
    if (*(int *)(in_RDI + 0x40) - *(uint *)(in_RDI + 0x3c) < uVar3) {
      local_68 = lj_buf_more2(local_98,in_stack_fffffffffffffecc);
    }
    else {
      local_68 = (char *)(ulong)*(uint *)(in_RDI + 0x3c);
    }
    memcpy(local_68,(void *)(uVar5 + 0x10),(ulong)uVar3);
    *(uint *)(in_RDI + 0x3c) = (int)local_68 + uVar3;
  }
  *in_RDX = (ulong)(uint)(*(int *)(in_RDI + 0x3c) - *(int *)(in_RDI + 0x44));
  local_e4 = 0;
  uVar3 = *(uint *)(in_RDI + 0x8c);
  for (local_d0 = (uint *)(lVar2 + (ulong)*(uint *)(in_RSI + 0x54) * 0x10);
      local_d0 < (uint *)(lVar2 + (ulong)uVar3 * 0x10); local_d0 = local_d0 + 4) {
    if ((*(byte *)((long)local_d0 + 0xd) & 6) == 0) {
      uVar4 = *local_d0;
      uVar5 = (ulong)uVar4;
      if (uVar5 < 7) {
        if (*(int *)(in_RDI + 0x40) - *(uint *)(in_RDI + 0x3c) < 0xb) {
          local_80 = lj_buf_more2(local_98,in_stack_fffffffffffffecc);
        }
        else {
          local_80 = (char *)(ulong)*(uint *)(in_RDI + 0x3c);
        }
        local_118 = local_80 + 1;
        *local_80 = (char)uVar4;
      }
      else {
        uVar4 = *(int *)(uVar5 + 0xc) + 1;
        if (*(int *)(in_RDI + 0x40) - *(uint *)(in_RDI + 0x3c) < *(int *)(uVar5 + 0xc) + 0xbU) {
          local_98 = (SBuf *)lj_buf_more2(local_98,in_stack_fffffffffffffecc);
        }
        else {
          local_98 = (SBuf *)(ulong)*(uint *)(in_RDI + 0x3c);
        }
        memcpy(local_98,(void *)(uVar5 + 0x10),(ulong)uVar4);
        local_118 = (char *)((long)&(local_98->p).ptr32 + (ulong)uVar4);
      }
      uVar4 = local_d0[1];
      pcVar6 = lj_strfmt_wuleb128(local_118,uVar4 - local_e4);
      pcVar6 = lj_strfmt_wuleb128(pcVar6,local_d0[2] - uVar4);
      *(int *)(in_RDI + 0x3c) = (int)pcVar6;
      local_e4 = uVar4;
    }
  }
  puVar7 = (uint *)(in_RDI + 0x3c);
  if (*(uint *)(in_RDI + 0x40) == *puVar7) {
    local_8 = lj_buf_more2(local_98,in_stack_fffffffffffffecc);
  }
  else {
    local_8 = (char *)(ulong)*puVar7;
  }
  *local_8 = '\0';
  *puVar7 = (int)local_8 + 1;
  return (ulong)(uint)(*(int *)(in_RDI + 0x3c) - *(int *)(in_RDI + 0x44));
}

Assistant:

static size_t fs_prep_var(LexState *ls, FuncState *fs, size_t *ofsvar)
{
  VarInfo *vs =ls->vstack, *ve;
  MSize i, n;
  BCPos lastpc;
  lj_buf_reset(&ls->sb);  /* Copy to temp. string buffer. */
  /* Store upvalue names. */
  for (i = 0, n = fs->nuv; i < n; i++) {
    GCstr *s = strref(vs[fs->uvmap[i]].name);
    MSize len = s->len+1;
    char *p = lj_buf_more(&ls->sb, len);
    p = lj_buf_wmem(p, strdata(s), len);
    setsbufP(&ls->sb, p);
  }
  *ofsvar = sbuflen(&ls->sb);
  lastpc = 0;
  /* Store local variable names and compressed ranges. */
  for (ve = vs + ls->vtop, vs += fs->vbase; vs < ve; vs++) {
    if (!gola_isgotolabel(vs)) {
      GCstr *s = strref(vs->name);
      BCPos startpc;
      char *p;
      if ((uintptr_t)s < VARNAME__MAX) {
	p = lj_buf_more(&ls->sb, 1 + 2*5);
	*p++ = (char)(uintptr_t)s;
      } else {
	MSize len = s->len+1;
	p = lj_buf_more(&ls->sb, len + 2*5);
	p = lj_buf_wmem(p, strdata(s), len);
      }
      startpc = vs->startpc;
      p = lj_strfmt_wuleb128(p, startpc-lastpc);
      p = lj_strfmt_wuleb128(p, vs->endpc-startpc);
      setsbufP(&ls->sb, p);
      lastpc = startpc;
    }
  }
  lj_buf_putb(&ls->sb, '\0');  /* Terminator for varinfo. */
  return sbuflen(&ls->sb);
}